

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O1

void __thiscall gimage::PNGImageIO::load(PNGImageIO *this,ImageU8 *image,uint8 *data,size_t length)

{
  uchar *puVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  __jmp_buf_tag *__env;
  void *pvVar8;
  IOException *pIVar9;
  void *pvVar10;
  size_t __n;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong h;
  png_structp png;
  png_infop info;
  png_infop end;
  PNGReadData dp;
  long local_88;
  long local_80;
  string local_78;
  long local_58;
  void *local_50;
  uint8 *local_48;
  size_t local_40;
  undefined8 local_38;
  
  iVar5 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[0xd])(this,data,length);
  if ((char)iVar5 == '\0') {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Can only load PNG image format","");
    gutil::IOException::IOException(pIVar9,&local_78);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_88 = png_create_read_struct("1.6.37",0,0);
  if (local_88 == 0) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar9,&local_78);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_38 = 0;
  local_48 = data;
  local_40 = length;
  png_set_read_fn(local_88,&local_48,anon_unknown_2::readPNGData);
  local_80 = png_create_info_struct(local_88);
  if (local_80 == 0) {
    png_destroy_read_struct(&local_88,0);
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar9,&local_78);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_58 = png_create_info_struct(local_88);
  if (local_58 != 0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_88,longjmp,200);
    iVar5 = _setjmp(__env);
    if (iVar5 != 0) {
      png_destroy_read_struct(&local_88,&local_80,&local_58);
      pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Cannot read PNG image from memory","");
      gutil::IOException::IOException(pIVar9,&local_78);
      __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    png_read_info(local_88,local_80);
    uVar6 = png_get_image_width(local_88,local_80);
    uVar7 = png_get_image_height(local_88,local_80);
    h = (ulong)uVar7;
    bVar3 = png_get_color_type(local_88,local_80);
    uVar7 = 4;
    if (bVar3 != 6) {
      uVar7 = (uint)((bVar3 & 0xfe) == 2) * 2 + 1;
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(ulong)uVar6,h,(ulong)uVar7);
    sVar2 = image->n;
    __n = -sVar2;
    if (0 < (long)sVar2) {
      __n = sVar2;
    }
    memset(image->pixel,0,__n);
    if (bVar3 == 3) {
      png_set_palette_to_rgb(local_88);
    }
    bVar4 = png_get_bit_depth(local_88,local_80);
    if (bVar4 < 9) {
      if (bVar4 != 8 && bVar3 == 0) {
        png_set_expand_gray_1_2_4_to_8(local_88);
      }
      iVar5 = png_get_rowbytes(local_88,local_80);
      uVar11 = 0xffffffffffffffff;
      if (-1 < (long)((long)iVar5 * h)) {
        uVar11 = (long)iVar5 * h;
      }
      local_50 = operator_new__(uVar11);
      pvVar8 = operator_new__(h * 8);
      if (h != 0) {
        uVar11 = 0;
        pvVar10 = local_50;
        do {
          *(void **)((long)pvVar8 + uVar11 * 8) = pvVar10;
          uVar11 = uVar11 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)iVar5);
        } while (h != uVar11);
      }
      png_read_image(local_88,pvVar8);
      if (h != 0) {
        uVar11 = 0;
        do {
          if (uVar6 != 0) {
            uVar13 = 0;
            uVar12 = uVar13;
            do {
              uVar12 = (ulong)(int)uVar12;
              uVar14 = 0;
              do {
                puVar1 = (uchar *)(*(long *)((long)pvVar8 + uVar11 * 8) + uVar12);
                uVar12 = uVar12 + 1;
                image->img[uVar14][uVar11][uVar13] = *puVar1;
                uVar14 = uVar14 + 1;
              } while (uVar7 != uVar14);
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar6);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != h);
      }
      operator_delete__(pvVar8);
      operator_delete__(local_50);
      png_destroy_read_struct(&local_88,&local_80,&local_58);
      return;
    }
    png_destroy_read_struct(&local_88,&local_80,&local_58);
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"PNG image with <= 8 bits expected","");
    gutil::IOException::IOException(pIVar9,&local_78);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_destroy_read_struct(&local_88,&local_80,0);
  pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Cannot allocate PNG info structure","");
  gutil::IOException::IOException(pIVar9,&local_78);
  __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNGImageIO::load(ImageU8 &image, gutil::uint8 *data, size_t length) const
{
  if (!handles(data, length))
  {
    throw gutil::IOException("Can only load PNG image format");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  PNGReadData dp;
  dp.data=data;
  dp.length=length;
  dp.i=0;

  png_set_read_fn(png, &dp, readPNGData);

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("Cannot read PNG image from memory");
  }

  // read header data

  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB)
  {
    depth=3;
  }

  if (color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=4;
  }

  image.setSize(width, height, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    throw gutil::IOException("PNG image with <= 8 bits expected");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  for (long k=0; k<height; k++)
  {
    int j=0;

    for (long i=0; i<width; i++)
    {
      for (int d=0; d<depth; d++)
      {
        image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
}